

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

void bablk(int ba,int type,Item *q1,Item *q2)

{
  uint uVar1;
  Item *q1_00;
  Item *pIVar2;
  
  q1_00 = insertstr(q1->prev->prev,"/*");
  insertstr(q1,"*/\n");
  if (ba_list_ == (List *)0x0) {
    ba_list_ = newlist();
  }
  ba_index_ = ba_index_ + 1;
  sprintf(buf,"static void _ba%d(NrnThread* _nt, Memb_list* _ml, int _type) ");
  insertstr(q1,buf);
  pIVar2 = insertstr(q1->next,
                     "  double* _p; Datum* _ppvar; ThreadDatum* _thread;\n  int* _ni; double v; int _iml, _cntml_padded, _cntml_actual;\n  _cntml_actual = _ml->_nodecount;\n  _cntml_padded = _ml->_nodecount_padded;\n  _ni = _ml->_nodeindices;\n  _thread = _ml->_thread;\n  double * _nt_data = _nt->_data;\n  double * _vec_v = _nt->_actual_v;\n  int stream_id = _nt->stream_id;\n  #if LAYOUT == 1 /*AoS*/\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n    _p = _ml->_data + _iml*_psize; _ppvar = _ml->_pdata + _iml*_ppsize;\n  #elif LAYOUT == 0 /*SoA*/\n    _p = _ml->_data; _ppvar = _ml->_pdata;\n  /* insert compiler dependent ivdep like pragma */\n  _PRAGMA_FOR_VECTOR_LOOP_\n  _PRAGMA_FOR_STATE_ACC_LOOP_\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n  #else /* LAYOUT > 1 */ /*AoSoA*/\n  #error AoSoA not implemented.\n  for (;;) { /* help clang-format properly indent */\n  #endif\n    v = _vec_v[_ni[_iml]];\n"
                    );
  insertstr(q2,"}\n");
  movelist(q1_00,q2,procfunc);
  uVar1 = 0x14;
  if (ba == 0x164) {
    uVar1 = 10;
  }
  lappenditem(ba_list_,pIVar2->next);
  lappenditem(ba_list_,q2);
  sprintf(buf,"%d",(ulong)((uint)(type == 0x109) * 3 +
                           (type == 0x130 | uVar1) + (uint)(type == 0x10b) * 2 +
                          (uint)(type == 0x118) * 4));
  lappendstr(ba_list_,buf);
  return;
}

Assistant:

void bablk(ba, type, q1, q2)
	int ba, type;
	Item *q1, *q2;
{
	Item* qb, *qv, *q;
	qb = insertstr(q1->prev->prev, "/*");
	insertstr(q1, "*/\n");
	if (!ba_list_) {
		ba_list_ = newlist();
	}
	sprintf(buf, "static void _ba%d(NrnThread* _nt, Memb_list* _ml, int _type) ", ++ba_index_);
	insertstr(q1, buf);
	q = q1->next;

	qv = insertstr(q, ""
"  double* _p; Datum* _ppvar; ThreadDatum* _thread;\n"
"  int* _ni; double v; int _iml, _cntml_padded, _cntml_actual;\n"
"  _cntml_actual = _ml->_nodecount;\n"
"  _cntml_padded = _ml->_nodecount_padded;\n"
"  _ni = _ml->_nodeindices;\n"
"  _thread = _ml->_thread;\n"
"  double * _nt_data = _nt->_data;\n"
"  double * _vec_v = _nt->_actual_v;\n"
"  int stream_id = _nt->stream_id;\n"
"  #if LAYOUT == 1 /*AoS*/\n"
"  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n"
"    _p = _ml->_data + _iml*_psize; _ppvar = _ml->_pdata + _iml*_ppsize;\n"
"  #elif LAYOUT == 0 /*SoA*/\n"
"    _p = _ml->_data; _ppvar = _ml->_pdata;\n"
"  /* insert compiler dependent ivdep like pragma */\n"
"  _PRAGMA_FOR_VECTOR_LOOP_\n"
"  _PRAGMA_FOR_STATE_ACC_LOOP_\n"
"  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n"
"  #else /* LAYOUT > 1 */ /*AoSoA*/\n"
"  #error AoSoA not implemented.\n"
"  for (;;) { /* help clang-format properly indent */\n"
"  #endif\n"
"    v = _vec_v[_ni[_iml]];\n"
);
	insertstr(q2, "}\n");
	movelist(qb, q2, procfunc);

	ba = (ba == BEFORE) ? 10 : 20; /* BEFORE or AFTER */
	ba += (type == BREAKPOINT) ? 1 : 0;
	ba += (type == SOLVE) ? 2 : 0;
	ba += (type == INITIAL1) ? 3 : 0;
	ba += (type == STEP) ? 4 : 0;
	lappenditem(ba_list_, qv->next);
	lappenditem(ba_list_, q2);
	sprintf(buf, "%d", ba);
	lappendstr(ba_list_, buf);
}